

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator * __thiscall
QMultiHash<QString,QCss::StyleRule>::emplace_helper<QCss::StyleRule_const&>
          (iterator *__return_storage_ptr__,void *this,QString *key,StyleRule *args)

{
  piter it;
  MultiNode<QString,_QCss::StyleRule> *n;
  long in_FS_OFFSET;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::findOrInsert<QString>
            ((InsertionResult *)local_48,*this,key);
  n = (MultiNode<QString,_QCss::StyleRule> *)
      ((*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].entries +
      (*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].offsets
      [(uint)local_48._8_8_ & 0x7f]);
  if (local_48[0x10] == false) {
    QHashPrivate::MultiNode<QString,QCss::StyleRule>::createInPlace<QCss::StyleRule_const&>
              (n,key,args);
  }
  else {
    QHashPrivate::MultiNode<QString,QCss::StyleRule>::insertMulti<QCss::StyleRule_const&>
              ((MultiNode<QString,QCss::StyleRule> *)n,args);
  }
  *(long *)((long)this + 8) = *(long *)((long)this + 8) + 1;
  it.bucket = local_48._8_8_;
  it.d = (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)local_48._0_8_;
  QMultiHash<QString,_QCss::StyleRule>::iterator::iterator(__return_storage_ptr__,it,(Chain **)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }